

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool server::serveroption(char *arg)

{
  int i;
  char *arg_local;
  
  if (*arg == '-') {
    switch(arg[1]) {
    case 'n':
      setsvar("serverdesc",arg + 2,true);
      arg_local._7_1_ = true;
      break;
    case 'o':
      i = atoi(arg + 2);
      setvar("publicserver",i,true,true);
      arg_local._7_1_ = true;
      break;
    case 'p':
      setsvar("adminpass",arg + 2,true);
      arg_local._7_1_ = true;
      break;
    default:
      goto LAB_0014ecf1;
    case 'y':
      setsvar("serverpass",arg + 2,true);
      arg_local._7_1_ = true;
    }
  }
  else {
LAB_0014ecf1:
    arg_local._7_1_ = false;
  }
  return arg_local._7_1_;
}

Assistant:

bool serveroption(const char *arg)
    {
        if(arg[0]=='-') switch(arg[1])
        {
            case 'n': setsvar("serverdesc", &arg[2]); return true;
            case 'y': setsvar("serverpass", &arg[2]); return true;
            case 'p': setsvar("adminpass", &arg[2]); return true;
            case 'o': setvar("publicserver", atoi(&arg[2])); return true;
        }
        return false;
    }